

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O3

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaNode *node)

{
  SymbolTable *this_00;
  element_type *peVar1;
  SemanticAnalyser *pSVar2;
  tuple<Symbol_*,_std::default_delete<Symbol>_> tVar3;
  _Elt_pointer pRVar4;
  mapped_type *pmVar5;
  long *plVar6;
  size_type *psVar7;
  _List_node_base *p_Var8;
  value_type returnInfo;
  __uniq_ptr_impl<Symbol,_std::default_delete<Symbol>_> local_d8;
  string local_d0;
  undefined8 local_b0;
  undefined4 local_a8;
  SemanticAnalyser *local_a0;
  stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = &this->hasReturn_;
  local_d0._M_dataplus._M_p = local_d0._M_dataplus._M_p & 0xffffffffffffff00;
  local_d0._M_string_length = local_d0._M_string_length & 0xffffffffffffff00;
  std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>::
  emplace_back<SemanticAnalyser::ReturnInfo>(&local_98->c,(ReturnInfo *)&local_d0);
  this_00 = &this->symbols_;
  local_a0 = this;
  SymbolTable::enterScope(this_00);
  p_Var8 = (node->arguments_).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)&node->arguments_) {
    do {
      tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)operator_new(0x30);
      *(undefined ***)
       tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
       super__Head_base<0UL,_Symbol_*,_false>._M_head_impl = &PTR__VariableSymbol_001500f0;
      *(long **)((long)tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                       super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8) =
           (long *)((long)tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                          super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 0x18);
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                        super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8),p_Var8[1]._M_next,
                 (long)&(p_Var8[1]._M_prev)->_M_next + (long)p_Var8[1]._M_next);
      *(undefined4 *)
       ((long)tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
              super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 0x28) =
           *(undefined4 *)&p_Var8[3]._M_next;
      local_d8._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
           (tuple<Symbol_*,_std::default_delete<Symbol>_>)
           (tuple<Symbol_*,_std::default_delete<Symbol>_>)
           tVar3.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
           super__Head_base<0UL,_Symbol_*,_false>._M_head_impl;
      SymbolTable::addSymbol
                (this_00,(string *)(p_Var8 + 1),
                 (unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_d8);
      if ((_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)
          local_d8._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
          super__Head_base<0UL,_Symbol_*,_false>._M_head_impl != (Symbol *)0x0) {
        (**(code **)(*(long *)local_d8._M_t.
                              super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                              super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8))();
      }
      local_d8._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
           (tuple<Symbol_*,_std::default_delete<Symbol>_>)
           (_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)0x0;
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)&node->arguments_);
  }
  pSVar2 = local_a0;
  peVar1 = (node->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_StatementNode).super_Node._vptr_Node[2])(peVar1,local_a0);
  SymbolTable::leaveScope(this_00);
  pRVar4 = (pSVar2->hasReturn_).c.
           super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pRVar4 == (pSVar2->hasReturn_).c.
                super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pRVar4 = (pSVar2->hasReturn_).c.
             super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  local_a8 = *(undefined4 *)
              &pRVar4[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
               super__Optional_payload_base<TypeName>._M_engaged;
  local_b0._0_1_ = pRVar4[-1].hasReturn;
  local_b0._1_3_ = *(undefined3 *)&pRVar4[-1].field_0x1;
  local_b0._4_4_ =
       *(TypeName *)
        &pRVar4[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
         super__Optional_payload_base<TypeName>._M_payload;
  std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>::pop_back
            (&local_98->c);
  if (node->returnType_ == Void) {
    if ((char)local_b0 != '\0') {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Void lambda does return!","");
      reportError(&local_d0,(Node *)node);
    }
  }
  else {
    if ((char)local_b0 == '\0') {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Lambda does not return any value!","");
      reportError(&local_d0,(Node *)node);
    }
    if (((char)local_a8 == '\x01') && (node->returnType_ != local_b0._4_4_)) {
      pmVar5 = std::
               unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(&TypeNameStrings_abi_cxx11_,&node->returnType_);
      std::operator+(&local_50,"Lambda should return ",pmVar5);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90.field_2._8_8_ = plVar6[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar7;
      }
      local_90._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pmVar5 = std::
               unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(&TypeNameStrings_abi_cxx11_,(key_type *)((long)&local_b0 + 4));
      std::operator+(&local_70,&local_90,pmVar5);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar7) {
        local_d0.field_2._M_allocated_capacity = *psVar7;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar7;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      reportError(&local_d0,(Node *)node);
    }
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const LambdaNode& node) 
{
  hasReturn_.push({});
  symbols_.enterScope();

  for(const auto& arg : node.getArguments())
  {
    symbols_.addSymbol(arg.first, std::make_unique<VariableSymbol>(arg.first, arg.second));
  }

  node.getBody().accept(*this);

  symbols_.leaveScope();
  const auto returnInfo = hasReturn_.top();
  hasReturn_.pop();

  if(node.getReturnType() != TypeName::Void && !returnInfo.hasReturn)
    reportError("Lambda does not return any value!", node);
  else if(node.getReturnType() == TypeName::Void && returnInfo.hasReturn)
    reportError("Void lambda does return!", node);
  else if(node.getReturnType() != TypeName::Void && 
    returnInfo.type.has_value() && node.getReturnType() != returnInfo.type.value())
    reportError("Lambda should return " + 
      TypeNameStrings.at(node.getReturnType()) + ", but returns " + 
        TypeNameStrings.at(returnInfo.type.value()) + "!", node);
}